

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void arm::display_cond(ConditionCode cond,ostream *o)

{
  ostream *in_RSI;
  undefined1 in_DIL;
  
  switch(in_DIL) {
  case 0:
    std::operator<<(in_RSI,"eq");
    break;
  case 1:
    std::operator<<(in_RSI,"ne");
    break;
  case 2:
    std::operator<<(in_RSI,"cs");
    break;
  case 3:
    std::operator<<(in_RSI,"hs");
    break;
  case 4:
    std::operator<<(in_RSI,"cc");
    break;
  case 5:
    std::operator<<(in_RSI,"lo");
    break;
  case 6:
    std::operator<<(in_RSI,"mn");
    break;
  case 7:
    std::operator<<(in_RSI,"pl");
    break;
  case 8:
    std::operator<<(in_RSI,"vs");
    break;
  case 9:
    std::operator<<(in_RSI,"vc");
    break;
  case 10:
    std::operator<<(in_RSI,"hi");
    break;
  case 0xb:
    std::operator<<(in_RSI,"ls");
    break;
  case 0xc:
    std::operator<<(in_RSI,"ge");
    break;
  case 0xd:
    std::operator<<(in_RSI,"lt");
    break;
  case 0xe:
    std::operator<<(in_RSI,"gt");
    break;
  case 0xf:
    std::operator<<(in_RSI,"le");
    break;
  case 0x10:
  }
  return;
}

Assistant:

void display_cond(ConditionCode cond, std::ostream &o) {
  switch (cond) {
    case ConditionCode::Equal:
      o << "eq";
      break;
    case ConditionCode::NotEqual:
      o << "ne";
      break;
    case ConditionCode::CarrySet:
      o << "cs";
      break;
    case ConditionCode::CarryClear:
      o << "cc";
      break;
    case ConditionCode::UnsignedGe:
      o << "hs";
      break;
    case ConditionCode::UnsignedLe:
      o << "ls";
      break;
    case ConditionCode::UnsignedGt:
      o << "hi";
      break;
    case ConditionCode::UnsignedLt:
      o << "lo";
      break;
    case ConditionCode::MinusOrNegative:
      o << "mn";
      break;
    case ConditionCode::PositiveOrZero:
      o << "pl";
      break;
    case ConditionCode::Overflow:
      o << "vs";
      break;
    case ConditionCode::NoOverflow:
      o << "vc";
      break;
    case ConditionCode::Ge:
      o << "ge";
      break;
    case ConditionCode::Lt:
      o << "lt";
      break;
    case ConditionCode::Gt:
      o << "gt";
      break;
    case ConditionCode::Le:
      o << "le";
      break;
    case ConditionCode::Always:
      // AL is default
      break;
  }
}